

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_SHA2_512.c
# Opt level: O2

void Hacl_SHA2_512_hash(uint8_t *hash1,uint8_t *input,uint32_t len)

{
  uint32_t _i;
  long lVar1;
  uint64_t state [169];
  uint64_t local_568 [169];
  
  for (lVar1 = 0; lVar1 != 0xa9; lVar1 = lVar1 + 1) {
    local_568[lVar1] = 0;
  }
  local_568[0] = 0x428a2f98d728ae22;
  local_568[1] = 0x7137449123ef65cd;
  local_568[2] = 0xb5c0fbcfec4d3b2f;
  local_568[3] = 0xe9b5dba58189dbbc;
  local_568[4] = 0x3956c25bf348b538;
  local_568[5] = 0x59f111f1b605d019;
  local_568[6] = 0x923f82a4af194f9b;
  local_568[7] = 0xab1c5ed5da6d8118;
  local_568[8] = 0xd807aa98a3030242;
  local_568[9] = 0x12835b0145706fbe;
  local_568[10] = 0x243185be4ee4b28c;
  local_568[0xb] = 0x550c7dc3d5ffb4e2;
  local_568[0xc] = 0x72be5d74f27b896f;
  local_568[0xd] = 0x80deb1fe3b1696b1;
  local_568[0xe] = 0x9bdc06a725c71235;
  local_568[0xf] = 0xc19bf174cf692694;
  local_568[0x10] = 0xe49b69c19ef14ad2;
  local_568[0x11] = 0xefbe4786384f25e3;
  local_568[0x12] = 0xfc19dc68b8cd5b5;
  local_568[0x13] = 0x240ca1cc77ac9c65;
  local_568[0x14] = 0x2de92c6f592b0275;
  local_568[0x15] = 0x4a7484aa6ea6e483;
  local_568[0x16] = 0x5cb0a9dcbd41fbd4;
  local_568[0x17] = 0x76f988da831153b5;
  local_568[0x18] = 0x983e5152ee66dfab;
  local_568[0x19] = 0xa831c66d2db43210;
  local_568[0x1a] = 0xb00327c898fb213f;
  local_568[0x1b] = 0xbf597fc7beef0ee4;
  local_568[0x1c] = 0xc6e00bf33da88fc2;
  local_568[0x1d] = 0xd5a79147930aa725;
  local_568[0x1e] = 0x6ca6351e003826f;
  local_568[0x1f] = 0x142929670a0e6e70;
  local_568[0x20] = 0x27b70a8546d22ffc;
  local_568[0x21] = 0x2e1b21385c26c926;
  local_568[0x22] = 0x4d2c6dfc5ac42aed;
  local_568[0x23] = 0x53380d139d95b3df;
  local_568[0x24] = 0x650a73548baf63de;
  local_568[0x25] = 0x766a0abb3c77b2a8;
  local_568[0x26] = 0x81c2c92e47edaee6;
  local_568[0x27] = 0x92722c851482353b;
  local_568[0x28] = 0xa2bfe8a14cf10364;
  local_568[0x29] = 0xa81a664bbc423001;
  local_568[0x2a] = 0xc24b8b70d0f89791;
  local_568[0x2b] = 0xc76c51a30654be30;
  local_568[0x2c] = 0xd192e819d6ef5218;
  local_568[0x2d] = 0xd69906245565a910;
  local_568[0x2e] = 0xf40e35855771202a;
  local_568[0x2f] = 0x106aa07032bbd1b8;
  local_568[0x30] = 0x19a4c116b8d2d0c8;
  local_568[0x31] = 0x1e376c085141ab53;
  local_568[0x32] = 0x2748774cdf8eeb99;
  local_568[0x33] = 0x34b0bcb5e19b48a8;
  local_568[0x34] = 0x391c0cb3c5c95a63;
  local_568[0x35] = 0x4ed8aa4ae3418acb;
  local_568[0x36] = 0x5b9cca4f7763e373;
  local_568[0x37] = 0x682e6ff3d6b2b8a3;
  local_568[0x38] = 0x748f82ee5defb2fc;
  local_568[0x39] = 0x78a5636f43172f60;
  local_568[0x3a] = 0x84c87814a1f0ab72;
  local_568[0x3b] = 0x8cc702081a6439ec;
  local_568[0x3c] = 0x90befffa23631e28;
  local_568[0x3d] = 0xa4506cebde82bde9;
  local_568[0x3e] = 0xbef9a3f7b2c67915;
  local_568[0x3f] = 0xc67178f2e372532b;
  local_568[0x40] = 0xca273eceea26619c;
  local_568[0x41] = 0xd186b8c721c0c207;
  local_568[0x42] = 0xeada7dd6cde0eb1e;
  local_568[0x43] = 0xf57d4f7fee6ed178;
  local_568[0x44] = 0x6f067aa72176fba;
  local_568[0x45] = 0xa637dc5a2c898a6;
  local_568[0x46] = 0x113f9804bef90dae;
  local_568[0x47] = 0x1b710b35131c471b;
  local_568[0x48] = 0x28db77f523047d84;
  local_568[0x49] = 0x32caab7b40c72493;
  local_568[0x4a] = 0x3c9ebe0a15c9bebc;
  local_568[0x4b] = 0x431d67c49c100d4c;
  local_568[0x4c] = 0x4cc5d4becb3e42b6;
  local_568[0x4d] = 0x597f299cfc657e2a;
  local_568[0x4e] = 0x5fcb6fab3ad6faec;
  local_568[0x4f] = 0x6c44198c4a475817;
  local_568[0xa0] = 0x6a09e667f3bcc908;
  local_568[0xa1] = 0xbb67ae8584caa73b;
  local_568[0xa2] = 0x3c6ef372fe94f82b;
  local_568[0xa3] = 0xa54ff53a5f1d36f1;
  local_568[0xa4] = 0x510e527fade682d1;
  local_568[0xa5] = 0x9b05688c2b3e6c1f;
  local_568[0xa6] = 0x1f83d9abfb41bd6b;
  local_568[0xa7] = 0x5be0cd19137e2179;
  Hacl_Impl_SHA2_512_update_multi(local_568,input,len >> 7);
  Hacl_Impl_SHA2_512_update_last(local_568,input + (len & 0xffffff80),(ulong)(len & 0x7f));
  Hacl_Impl_SHA2_512_finish(local_568,hash1);
  return;
}

Assistant:

void Hacl_SHA2_512_hash(uint8_t *hash1, uint8_t *input, uint32_t len)
{
  Hacl_Impl_SHA2_512_hash(hash1, input, len);
}